

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

bool __thiscall BaseIndex::Rewind(BaseIndex *this,CBlockIndex *current_tip,CBlockIndex *new_tip)

{
  uint256 *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  CBlockIndex *pCVar5;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  int local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_best_block_index)._M_b._M_p != current_tip) {
    __assert_fail("current_tip == m_best_block_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                  ,0xf9,"bool BaseIndex::Rewind(const CBlockIndex *, const CBlockIndex *)");
  }
  pCVar5 = CBlockIndex::GetAncestor(current_tip,new_tip->nHeight);
  if (pCVar5 != new_tip) {
    __assert_fail("current_tip->GetAncestor(new_tip->nHeight) == new_tip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                  ,0xfa,"bool BaseIndex::Rewind(const CBlockIndex *, const CBlockIndex *)");
  }
  puVar1 = current_tip->phashBlock;
  if (puVar1 == (uint256 *)0x0) {
LAB_0046f0ef:
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  local_48 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
  uStack_40 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
  local_38 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_30 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
  local_28 = current_tip->nHeight;
  if (new_tip->phashBlock == (uint256 *)0x0) goto LAB_0046f0ef;
  iVar4 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xe])(this,&local_48);
  if ((char)iVar4 != '\0') {
    SetBestBlockIndex(this,new_tip);
    bVar2 = Commit(this);
    bVar3 = true;
    if (bVar2) goto LAB_0046f0d5;
    SetBestBlockIndex(this,current_tip);
  }
  bVar3 = false;
LAB_0046f0d5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::Rewind(const CBlockIndex* current_tip, const CBlockIndex* new_tip)
{
    assert(current_tip == m_best_block_index);
    assert(current_tip->GetAncestor(new_tip->nHeight) == new_tip);

    if (!CustomRewind({current_tip->GetBlockHash(), current_tip->nHeight}, {new_tip->GetBlockHash(), new_tip->nHeight})) {
        return false;
    }

    // In the case of a reorg, ensure persisted block locator is not stale.
    // Pruning has a minimum of 288 blocks-to-keep and getting the index
    // out of sync may be possible but a users fault.
    // In case we reorg beyond the pruned depth, ReadBlockFromDisk would
    // throw and lead to a graceful shutdown
    SetBestBlockIndex(new_tip);
    if (!Commit()) {
        // If commit fails, revert the best block index to avoid corruption.
        SetBestBlockIndex(current_tip);
        return false;
    }

    return true;
}